

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_decoder.c
# Opt level: O1

int pt_blk_fetch_event(pt_block_decoder *decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  
  uVar1 = (decoder->event).lost_mtc;
  uVar2 = (decoder->event).lost_cyc;
  decoder->tsc = (decoder->event).tsc;
  decoder->lost_mtc = uVar1;
  decoder->lost_cyc = uVar2;
  *(ushort *)&decoder->field_0xa74 =
       (ushort)*(undefined4 *)&decoder->field_0xa74 & 0xfffb | (byte)(decoder->event).field_0x4 & 4;
  iVar3 = pt_evt_next(&decoder->evdec,&decoder->event,0x48);
  if (iVar3 < 0) {
    decoder->status = iVar3;
    (decoder->event).variant.mwait.hints = 0xffffffff;
    (decoder->event).variant.mwait.ext = 0xffffffff;
    *(undefined4 *)((long)&(decoder->event).variant + 0x10) = 0xffffffff;
    *(undefined4 *)((long)&(decoder->event).variant + 0x14) = 0xffffffff;
    *(undefined4 *)((decoder->event).reserved + 1) = 0xffffffff;
    *(undefined4 *)((long)(decoder->event).reserved + 0xc) = 0xffffffff;
    (decoder->event).variant.exec_mode.mode = ~ptem_unknown;
    *(undefined4 *)((long)&(decoder->event).variant + 4) = 0xffffffff;
    (decoder->event).lost_mtc = 0xffffffff;
    (decoder->event).lost_cyc = 0xffffffff;
    *(undefined4 *)(decoder->event).reserved = 0xffffffff;
    *(undefined4 *)((long)(decoder->event).reserved + 4) = 0xffffffff;
    (decoder->event).type = ~ptev_enabled;
    *(undefined4 *)&(decoder->event).field_0x4 = 0xffffffff;
    *(undefined4 *)&(decoder->event).tsc = 0xffffffff;
    *(undefined4 *)((long)&(decoder->event).tsc + 4) = 0xffffffff;
    (decoder->event).variant.vmexit.ip = 0xffffffffffffffff;
  }
  return iVar3;
}

Assistant:

static int pt_blk_fetch_event(struct pt_block_decoder *decoder)
{
	struct pt_event *ev;
	int errcode;

	if (!decoder)
		return -pte_internal;

	ev = &decoder->event;
	decoder->tsc = ev->tsc;
	decoder->has_tsc = ev->has_tsc;
	decoder->lost_mtc = ev->lost_mtc;
	decoder->lost_cyc = ev->lost_cyc;

	errcode = pt_evt_next(&decoder->evdec, ev, sizeof(*ev));
	if (errcode < 0) {
		decoder->status = errcode;
		memset(ev, 0xff, sizeof(*ev));
	}

	return 0;
}